

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_vorbis.c
# Opt level: O1

int stb_vorbis_seek_frame(stb_vorbis *f,uint sample_number)

{
  long lVar1;
  uint uVar2;
  int iVar3;
  uint uVar4;
  uint32 uVar5;
  int iVar6;
  int iVar7;
  ulong uVar8;
  uint uVar9;
  STBVorbisError SVar10;
  ProbedPage *z;
  uint uVar11;
  bool bVar12;
  double dVar13;
  double dVar14;
  undefined4 uVar15;
  undefined4 uVar16;
  uint end;
  ProbedPage left;
  int left_end;
  int mode;
  int right_end;
  uint local_84;
  ProbedPage local_80;
  uint local_74;
  uint32 local_70;
  ProbedPage local_6c;
  ulong local_60;
  int local_54;
  double local_50;
  double local_48;
  double local_40;
  int local_34;
  
  if (f->push_mode != '\0') {
    f->error = VORBIS_invalid_api_mixing;
    return 0;
  }
  uVar2 = stb_vorbis_stream_length_in_samples(f);
  if (uVar2 == 0) {
    SVar10 = VORBIS_seek_without_length;
  }
  else {
    SVar10 = VORBIS_seek_invalid;
    if (sample_number <= uVar2) {
      uVar2 = f->blocksize_1 - f->blocksize_0 >> 2;
      uVar11 = sample_number - uVar2;
      if (sample_number < uVar2) {
        uVar11 = 0;
      }
      local_80.last_decoded_sample = (f->p_first).last_decoded_sample;
      z = &local_80;
      local_80.page_start = (f->p_first).page_start;
      local_80.page_end = (f->p_first).page_end;
      do {
        if (local_80.last_decoded_sample != 0xffffffff) {
          if (uVar11 <= local_80.last_decoded_sample) {
            iVar3 = stb_vorbis_seek_start(f);
            goto joined_r0x00182510;
          }
          uVar2 = (f->p_last).page_start;
          uVar8 = (ulong)uVar2;
          if (local_80.page_end == uVar2) goto LAB_00182063;
          local_70 = (f->p_last).page_end;
          local_40 = (double)uVar11;
          local_74 = (f->p_last).last_decoded_sample;
          uVar2 = 0;
          local_50 = 0.0;
          local_48 = 0.0;
          goto LAB_001822cf;
        }
        set_file_offset(f,local_80.page_end);
        iVar3 = get_seek_page_info(f,z);
      } while (iVar3 != 0);
LAB_00182019:
      stb_vorbis_seek_start(f);
      SVar10 = VORBIS_seek_failed;
    }
  }
  goto LAB_0018202f;
  while( true ) {
    uVar2 = uVar2 + 1;
    if (local_80.page_end == (uint)uVar8) break;
LAB_001822cf:
    uVar4 = (int)uVar8 - local_80.page_end;
    local_60 = uVar8;
    if (uVar4 < 0x10001) {
      set_file_offset(f,local_80.page_end);
    }
    else {
      if (uVar2 < 2) {
        if (uVar2 == 0) {
          local_50 = (double)(local_70 - local_80.page_start) / (double)local_74;
          dVar14 = (double)(uVar11 - local_80.last_decoded_sample) * local_50 +
                   (double)(local_80._0_8_ & 0xffffffff);
        }
        else {
          dVar14 = (local_40 - (double)local_6c.last_decoded_sample) * local_50;
          dVar13 = 8000.0;
          if (8000.0 <= dVar14) {
            dVar13 = dVar14;
          }
          dVar14 = (double)(~-(ulong)(0.0 <= dVar14) & (ulong)dVar14 |
                           (ulong)dVar13 & -(ulong)(0.0 <= dVar14));
          uVar15 = 0;
          uVar16 = 0xc0bf4000;
          if (dVar14 <= -8000.0) {
            uVar15 = SUB84(dVar14,0);
            uVar16 = (undefined4)((ulong)dVar14 >> 0x20);
          }
          dVar14 = (double)(~-(ulong)(dVar14 < 0.0) & (ulong)dVar14 |
                           CONCAT44(uVar16,uVar15) & -(ulong)(dVar14 < 0.0));
          dVar14 = dVar14 + dVar14 + local_48;
        }
        local_48 = (double)((int)uVar8 - 0x10000);
        dVar13 = (double)local_80.page_end;
        if ((double)local_80.page_end <= dVar14) {
          dVar13 = dVar14;
        }
        if (dVar13 <= local_48) {
          local_48 = dVar13;
        }
        uVar9 = (uint)(long)local_48;
      }
      else {
        uVar9 = (local_80.page_end + (uVar4 >> 1)) - 0x8000;
      }
      set_file_offset(f,uVar9);
      uVar5 = vorbis_find_page(f,(uint32 *)0x0,(uint32 *)0x0);
      if (uVar5 == 0) goto LAB_00182019;
    }
    while( true ) {
      iVar3 = get_seek_page_info(f,&local_6c);
      if (iVar3 == 0) goto LAB_00182019;
      if (local_6c.last_decoded_sample != 0xffffffff) break;
      set_file_offset(f,local_6c.page_end);
    }
    uVar8 = local_60;
    if (local_6c.page_start == (uint)local_60) {
      if ((1 < uVar2) || (uVar4 < 0x10001)) break;
    }
    else if (uVar11 < local_6c.last_decoded_sample) {
      local_70 = local_6c.page_end;
      local_74 = local_6c.last_decoded_sample;
      uVar8 = (ulong)local_6c.page_start;
    }
    else {
      local_80.last_decoded_sample = local_6c.last_decoded_sample;
      local_80._0_8_ = CONCAT44(local_6c.page_end,local_6c.page_start);
    }
  }
LAB_00182063:
  uVar2 = local_80.page_start;
  set_file_offset(f,local_80.page_start);
  iVar3 = start_page(f);
  SVar10 = VORBIS_seek_failed;
  if (iVar3 != 0) {
    uVar11 = f->end_seg_with_known_loc;
    do {
      z = (ProbedPage *)(ulong)uVar2;
      uVar8 = (ulong)uVar11;
      uVar4 = uVar11 + 1;
      while (uVar9 = (uint)uVar8, 0 < (int)uVar9) {
        uVar4 = uVar4 - 1;
        lVar1 = uVar8 - 1;
        uVar8 = uVar8 - 1;
        if (f->segments[lVar1] != 0xff) goto LAB_001824b2;
      }
      if ((f->page_flag & 1) == 0) {
        uVar4 = (int)uVar11 >> 0x1f & uVar11;
LAB_001824b2:
        f->current_loc_valid = 0;
        f->last_seg = 0;
        f->valid_bits = 0;
        f->packet_bytes = 0;
        f->bytes_in_seg = '\0';
        f->previous_length = 0;
        f->next_seg = uVar4;
        if (0 < (int)uVar9) {
          z = (ProbedPage *)0x0;
          do {
            skip(f,(uint)f->segments[(long)z]);
            z = (ProbedPage *)((long)&z->page_start + 1);
          } while ((ProbedPage *)(ulong)(uVar9 & 0x7fffffff) != z);
        }
        iVar3 = vorbis_pump_first_frame(f);
joined_r0x00182510:
        if (iVar3 == 0) {
          return 0;
        }
        SVar10 = VORBIS_seek_failed;
        if (sample_number < f->current_loc) break;
        local_60 = (ulong)(uint)(f->blocksize_1 * 3 - f->blocksize_0 >> 2);
        do {
          if (sample_number <= f->current_loc) {
            if (f->current_loc != sample_number) {
              f->error = VORBIS_seek_failed;
              return 0;
            }
            return 1;
          }
          iVar3 = vorbis_decode_initial
                            (f,(int *)&local_80,(int *)&local_6c,(int *)&local_84,&local_34,
                             &local_54);
          if (iVar3 == 0) {
LAB_00182241:
            f->error = VORBIS_seek_failed;
            bVar12 = false;
            z = (ProbedPage *)0x0;
          }
          else {
            iVar6 = ilog(f->mode_count + -1);
            bVar12 = f->mode_config[local_54].blockflag != '\0';
            iVar7 = iVar6 + (uint)bVar12 * 2 + 8;
            iVar6 = iVar6 + (uint)bVar12 * 2 + 0xf;
            if (-1 < iVar7) {
              iVar6 = iVar7;
            }
            iVar6 = iVar6 >> 3;
            f->bytes_in_seg = f->bytes_in_seg + (char)iVar6;
            f->packet_bytes = f->packet_bytes - iVar6;
            skip(f,-iVar6);
            iVar6 = f->next_seg;
            if (iVar6 == -1) {
              iVar6 = f->segment_count;
            }
            f->next_seg = iVar6 + -1;
            f->valid_bits = 0;
            if (iVar3 == 0) goto LAB_00182241;
            uVar2 = (local_84 - local_80.page_start) + f->current_loc;
            if (sample_number < uVar2) {
              z = (ProbedPage *)0x1;
              bVar12 = false;
            }
            else {
              if (sample_number < (int)local_60 + uVar2) {
                vorbis_pump_first_frame(f);
              }
              else {
                f->current_loc = uVar2;
                f->previous_length = 0;
                maybe_start_packet(f);
                do {
                  iVar3 = get8_packet_raw(f);
                } while (iVar3 != -1);
              }
              bVar12 = true;
            }
          }
          if (!bVar12) {
            return (int)z;
          }
        } while( true );
      }
      if ((uVar2 < 0x10000) ||
         (uVar11 = uVar2 - 0x10000, uVar2 - 0x10000 < f->first_audio_page_offset)) {
        uVar11 = f->first_audio_page_offset;
      }
      do {
        set_file_offset(f,uVar11);
        uVar5 = vorbis_find_page(f,&local_84,(uint32 *)0x0);
        if (uVar5 == 0) goto LAB_00182019;
        uVar11 = local_84;
      } while ((local_84 < uVar2) ||
              (uVar4 = stb_vorbis_get_file_offset(f), uVar11 = local_84, uVar2 <= uVar4));
      uVar2 = stb_vorbis_get_file_offset(f);
      iVar3 = start_page(f);
      if (iVar3 == 0) goto LAB_00182019;
      uVar11 = f->segment_count - 1;
    } while( true );
  }
LAB_0018202f:
  f->error = SVar10;
  return 0;
}

Assistant:

int stb_vorbis_seek_frame(stb_vorbis *f, unsigned int sample_number)
{
   uint32 max_frame_samples;

   if (IS_PUSH_MODE(f)) return error(f, VORBIS_invalid_api_mixing);

   // fast page-level search
   if (!seek_to_sample_coarse(f, sample_number))
      return 0;

   assert(f->current_loc_valid);
   assert(f->current_loc <= sample_number);

   // linear search for the relevant packet
   max_frame_samples = (f->blocksize_1*3 - f->blocksize_0) >> 2;
   while (f->current_loc < sample_number) {
      int left_start, left_end, right_start, right_end, mode, frame_samples;
      if (!peek_decode_initial(f, &left_start, &left_end, &right_start, &right_end, &mode))
         return error(f, VORBIS_seek_failed);
      // calculate the number of samples returned by the next frame
      frame_samples = right_start - left_start;
      if (f->current_loc + frame_samples > sample_number) {
         return 1; // the next frame will contain the sample
      } else if (f->current_loc + frame_samples + max_frame_samples > sample_number) {
         // there's a chance the frame after this could contain the sample
         vorbis_pump_first_frame(f);
      } else {
         // this frame is too early to be relevant
         f->current_loc += frame_samples;
         f->previous_length = 0;
         maybe_start_packet(f);
         flush_packet(f);
      }
   }
   // the next frame should start with the sample
   if (f->current_loc != sample_number) return error(f, VORBIS_seek_failed);
   return 1;
}